

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O1

double anon_unknown.dwarf_1f8e8::sampleX<float>
                 (TypedImageChannel<float> *channel,int w,double x,int y,Extrapolation ext)

{
  uint x_00;
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  float *pfVar5;
  uint x_01;
  double dVar6;
  double dVar7;
  
  if (0.0 <= x) {
    x_01 = (uint)x;
  }
  else {
    dVar6 = -x;
    x_01 = -((uint)((double)(int)dVar6 < dVar6) + (int)dVar6);
  }
  x_00 = x_01 + 1;
  switch(ext) {
  case BLACK:
    dVar7 = 0.0;
    dVar6 = 0.0;
    if ((int)x_01 < w && -1 < (int)x_01) {
      dVar6 = (double)(channel->_pixels)._data[(long)y * (channel->_pixels)._sizeY + (ulong)x_01];
    }
    if (w <= (int)x_00 || (int)x_01 < -1) goto LAB_00109754;
    pfVar5 = (channel->_pixels)._data + (long)y * (channel->_pixels)._sizeY;
    uVar3 = x_00;
    goto LAB_00109749;
  case CLAMP:
    uVar3 = w - 1;
    uVar1 = uVar3;
    if ((int)x_01 < (int)uVar3) {
      uVar1 = x_01;
    }
    if ((int)x_01 < 0) {
      uVar1 = 0;
    }
    if ((int)x_00 < (int)uVar3) {
      uVar3 = x_00;
    }
    if ((int)x_01 < -1) {
      uVar3 = 0;
    }
    pfVar5 = (channel->_pixels)._data + (long)y * (channel->_pixels)._sizeY;
    lVar4 = (long)(int)uVar1;
    break;
  case PERIODIC:
    if ((int)x_01 < 0) {
      if (-1 < w) {
        uVar1 = (~x_01 + w) / (uint)w;
        goto LAB_001096d0;
      }
      uVar1 = (~w - x_01) / (uint)-w;
    }
    else if (w < 0) {
      uVar1 = x_01 / (uint)-w;
LAB_001096d0:
      uVar1 = -uVar1;
    }
    else {
      uVar1 = x_01 / (uint)w;
    }
    if ((int)x_01 < -1) {
      if (-1 < w) {
        uVar3 = ((w - x_01) - 2) / (uint)w;
        goto LAB_00109715;
      }
      uVar3 = (~w - x_00) / (uint)-w;
    }
    else if (w < 0) {
      uVar3 = x_00 / (uint)-w;
LAB_00109715:
      uVar3 = -uVar3;
    }
    else {
      uVar3 = x_00 / (uint)w;
    }
    pfVar5 = (channel->_pixels)._data + (long)y * (channel->_pixels)._sizeY;
    uVar3 = x_00 - uVar3 * w;
    lVar4 = (long)(int)(x_01 - uVar1 * w);
    break;
  case MIRROR:
    iVar2 = mirror(x_01,w);
    uVar3 = mirror(x_00,w);
    pfVar5 = (channel->_pixels)._data + (long)y * (channel->_pixels)._sizeY;
    lVar4 = (long)iVar2;
    break;
  default:
    dVar6 = 0.0;
    dVar7 = 0.0;
    goto LAB_00109754;
  }
  dVar6 = (double)pfVar5[lVar4];
LAB_00109749:
  dVar7 = (double)pfVar5[(int)uVar3];
LAB_00109754:
  return ((double)(int)x_00 - x) * dVar6 + (1.0 - ((double)(int)x_00 - x)) * dVar7;
}

Assistant:

double
sampleX (
    const TypedImageChannel<T>& channel,
    int                         w,
    double                      x,
    int                         y,
    Extrapolation               ext)
{
    //
    // Sample an image channel at location (x, y), where
    // x is a floating point number, and y is an integer.
    //

    int    xs = IMATH_NAMESPACE::floor (x);
    int    xt = xs + 1;
    double s  = xt - x;
    double t  = 1 - s;
    double vs = 0.0;
    double vt = 0.0;

    switch (ext)
    {
        case BLACK:

            vs = (xs >= 0 && xs < w) ? double (channel (xs, y)) : 0.0;
            vt = (xt >= 0 && xt < w) ? double (channel (xt, y)) : 0.0;
            break;

        case CLAMP:

            xs = IMATH_NAMESPACE::clamp (xs, 0, w - 1);
            xt = IMATH_NAMESPACE::clamp (xt, 0, w - 1);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case PERIODIC:

            xs = modp (xs, w);
            xt = modp (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;

        case MIRROR:

            xs = mirror (xs, w);
            xt = mirror (xt, w);
            vs = channel (xs, y);
            vt = channel (xt, y);
            break;
    }

    return s * vs + t * vt;
}